

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNESROMHeader.cpp
# Opt level: O1

colorTransmissionSystem __thiscall SNESROMHeader::getColorTransmissionSystem(SNESROMHeader *this)

{
  return (colorTransmissionSystem)((byte)(this->m_HeaderData[0x19] - 2) < 0xb);
}

Assistant:

colorTransmissionSystem SNESROMHeader::getColorTransmissionSystem() const {
    if(m_HeaderData[m_CountryCodeIndex] <= 0x01) {
        return NTSC;
    } else if(m_HeaderData[m_CountryCodeIndex] <= 0x0C) {
        return PAL;
    } else {
        return NTSC;
    }
}